

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_Exor(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int fCompl;
  Aig_Obj_t *pResult;
  Aig_Obj_t *pGhost;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  Aig_Man_t *p_local;
  
  if (p0 == p1) {
    p_local = (Aig_Man_t *)Aig_Not(p->pConst1);
  }
  else {
    pAVar3 = Aig_Not(p1);
    if (p0 == pAVar3) {
      p_local = (Aig_Man_t *)p->pConst1;
    }
    else {
      pAVar3 = Aig_Regular(p0);
      if (pAVar3 == p->pConst1) {
        p_local = (Aig_Man_t *)Aig_NotCond(p1,(uint)(p0 == p->pConst1));
      }
      else {
        pAVar3 = Aig_Regular(p1);
        if (pAVar3 == p->pConst1) {
          p_local = (Aig_Man_t *)Aig_NotCond(p0,(uint)(p1 == p->pConst1));
        }
        else if (p->fCatchExor == 0) {
          pAVar3 = Aig_Not(p1);
          pAVar3 = Aig_And(p,p0,pAVar3);
          pAVar4 = Aig_Not(p0);
          pAVar4 = Aig_And(p,pAVar4,p1);
          p_local = (Aig_Man_t *)Aig_Or(p,pAVar3,pAVar4);
        }
        else {
          uVar1 = Aig_IsComplement(p0);
          uVar2 = Aig_IsComplement(p1);
          pAVar3 = Aig_Regular(p0);
          pAVar4 = Aig_Regular(p1);
          pAVar3 = Aig_ObjCreateGhost(p,pAVar3,pAVar4,AIG_OBJ_EXOR);
          pAVar4 = Aig_TableLookup(p,pAVar3);
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            pAVar3 = Aig_ObjCreate(p,pAVar3);
            p_local = (Aig_Man_t *)Aig_NotCond(pAVar3,uVar1 ^ uVar2);
          }
          else {
            p_local = (Aig_Man_t *)Aig_NotCond(pAVar4,uVar1 ^ uVar2);
          }
        }
      }
    }
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_Exor( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    int fCompl;
    // check trivial cases
    if ( p0 == p1 )
        return Aig_Not(p->pConst1);
    if ( p0 == Aig_Not(p1) )
        return p->pConst1;
    if ( Aig_Regular(p0) == p->pConst1 )
        return Aig_NotCond( p1, p0 == p->pConst1 );
    if ( Aig_Regular(p1) == p->pConst1 )
        return Aig_NotCond( p0, p1 == p->pConst1 );
    // when there is no special XOR gates
    if ( !p->fCatchExor )
        return Aig_Or( p, Aig_And(p, p0, Aig_Not(p1)), Aig_And(p, Aig_Not(p0), p1) );
    // canonicize
    fCompl = Aig_IsComplement(p0) ^ Aig_IsComplement(p1);
    p0 = Aig_Regular(p0);
    p1 = Aig_Regular(p1);
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_EXOR );
    // check the table
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return Aig_NotCond( pResult, fCompl );
    pResult = Aig_ObjCreate( p, pGhost );
    return Aig_NotCond( pResult, fCompl );
}